

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::IsLaterStandard(cmMakefile *this,string *lang,string *lhs,string *rhs)

{
  bool bVar1;
  char **ppcVar2;
  char **ppcVar3;
  string local_150;
  cmStrCmp local_130;
  string local_110;
  cmStrCmp local_f0;
  char **local_d0;
  char **rhsIt;
  cmStrCmp local_a8;
  string local_78;
  cmStrCmp local_58;
  char **local_38;
  char **rhsIt_1;
  string *rhs_local;
  string *lhs_local;
  string *lang_local;
  cmMakefile *this_local;
  
  rhsIt_1 = (char **)rhs;
  rhs_local = lhs;
  lhs_local = lang;
  lang_local = (string *)this;
  bVar1 = std::operator==(lang,"C");
  if (bVar1) {
    ppcVar2 = std::cbegin<char_const*[3]>(&C_STANDARDS);
    ppcVar3 = std::cend<char_const*[3]>(&C_STANDARDS);
    std::__cxx11::string::string((string *)&local_78,(string *)rhsIt_1);
    cmStrCmp::cmStrCmp(&local_58,&local_78);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_58);
    cmStrCmp::~cmStrCmp(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    local_38 = ppcVar2;
    ppcVar3 = std::cend<char_const*[3]>(&C_STANDARDS);
    std::__cxx11::string::string((string *)&rhsIt,(string *)rhs_local);
    cmStrCmp::cmStrCmp(&local_a8,(string *)&rhsIt);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_a8);
    ppcVar3 = std::cend<char_const*[3]>(&C_STANDARDS);
    this_local._7_1_ = ppcVar2 != ppcVar3;
    cmStrCmp::~cmStrCmp(&local_a8);
    std::__cxx11::string::~string((string *)&rhsIt);
  }
  else {
    ppcVar2 = std::cbegin<char_const*[5]>(&CXX_STANDARDS);
    ppcVar3 = std::cend<char_const*[5]>(&CXX_STANDARDS);
    std::__cxx11::string::string((string *)&local_110,(string *)rhsIt_1);
    cmStrCmp::cmStrCmp(&local_f0,&local_110);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_f0);
    cmStrCmp::~cmStrCmp(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    local_d0 = ppcVar2;
    ppcVar3 = std::cend<char_const*[5]>(&CXX_STANDARDS);
    std::__cxx11::string::string((string *)&local_150,(string *)rhs_local);
    cmStrCmp::cmStrCmp(&local_130,&local_150);
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>(ppcVar2,ppcVar3,&local_130);
    ppcVar3 = std::cend<char_const*[5]>(&CXX_STANDARDS);
    this_local._7_1_ = ppcVar2 != ppcVar3;
    cmStrCmp::~cmStrCmp(&local_130);
    std::__cxx11::string::~string((string *)&local_150);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::IsLaterStandard(std::string const& lang,
                                 std::string const& lhs,
                                 std::string const& rhs)
{
  if (lang == "C") {
    const char* const* rhsIt = std::find_if(
      cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS), cmStrCmp(rhs));

    return std::find_if(rhsIt, cm::cend(C_STANDARDS), cmStrCmp(lhs)) !=
      cm::cend(C_STANDARDS);
  }
  const char* const* rhsIt = std::find_if(
    cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS), cmStrCmp(rhs));

  return std::find_if(rhsIt, cm::cend(CXX_STANDARDS), cmStrCmp(lhs)) !=
    cm::cend(CXX_STANDARDS);
}